

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O0

void test13_should_be_parsed_without_null_termination(void)

{
  cJSON *item;
  long in_FS_OFFSET;
  cJSON *tree;
  char test_13_wo_null [178];
  undefined1 local_c8 [8];
  char test_13 [179];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_c8,
         "{\"Image\":{\"Width\":800,\"Height\":600,\"Title\":\"Viewfrom15thFloor\",\"Thumbnail\":{\"Url\":\"http:/*www.example.com/image/481989943\",\"Height\":125,\"Width\":\"100\"},\"IDs\":[116,943,234,38793]}}"
         ,0xb3);
  memcpy(&tree,local_c8,0xb2);
  item = cJSON_ParseWithLength((char *)&tree,0xb2);
  if (item == (cJSON *)0x0) {
    UnityFail("Failed to parse valid json.",0xdb);
  }
  else {
    cJSON_Delete(item);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void test13_should_be_parsed_without_null_termination(void)
{
    cJSON *tree = NULL;
    const char test_13[] = "{" \
                                "\"Image\":{" \
                                    "\"Width\":800," \
                                    "\"Height\":600," \
                                    "\"Title\":\"Viewfrom15thFloor\"," \
                                    "\"Thumbnail\":{" \
                                        "\"Url\":\"http:/*www.example.com/image/481989943\"," \
                                        "\"Height\":125," \
                                        "\"Width\":\"100\"" \
                                    "}," \
                                    "\"IDs\":[116,943,234,38793]" \
                                "}" \
                            "}";

    char test_13_wo_null[sizeof(test_13) - 1];
    memcpy(test_13_wo_null, test_13, sizeof(test_13) - 1);

    tree = cJSON_ParseWithLength(test_13_wo_null, sizeof(test_13) - 1);
    TEST_ASSERT_NOT_NULL_MESSAGE(tree, "Failed to parse valid json.");

    if (tree != NULL)
    {
        cJSON_Delete(tree);
    }
}